

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O1

void __thiscall despot::BaseRockSample::Init_11_11(BaseRockSample *this)

{
  pointer *ppCVar1;
  iterator __position;
  int *piVar2;
  long lVar3;
  Coord *this_00;
  int local_90;
  undefined4 uStack_8c;
  Coord local_88 [8];
  Coord local_80 [8];
  Coord local_78 [8];
  Coord local_70 [8];
  Coord local_68 [8];
  Coord local_60 [8];
  Coord local_58 [8];
  Coord local_50 [8];
  Coord local_48 [8];
  Coord local_40 [8];
  Coord local_38 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Using special layout for rocksample(11, 11)",0x2b);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  this_00 = local_88;
  despot::Coord::Coord(this_00,0,3);
  despot::Coord::Coord(local_80,0,7);
  despot::Coord::Coord(local_78,1,8);
  despot::Coord::Coord(local_70,2,4);
  despot::Coord::Coord(local_68,3,3);
  despot::Coord::Coord(local_60,3,8);
  despot::Coord::Coord(local_58,4,3);
  despot::Coord::Coord(local_50,5,8);
  despot::Coord::Coord(local_48,6,1);
  despot::Coord::Coord(local_40,9,3);
  despot::Coord::Coord(local_38,9,9);
  despot::Coord::Coord((Coord *)&local_90,0,5);
  *(ulong *)&this->start_pos_ = CONCAT44(uStack_8c,local_90);
  local_90 = -1;
  Grid<int>::SetAllValues(&this->grid_,&local_90);
  if (0 < this->num_rocks_) {
    lVar3 = 0;
    do {
      piVar2 = Grid<int>::operator()(&this->grid_,this_00);
      *piVar2 = (int)lVar3;
      __position._M_current =
           (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->rock_pos_).super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<despot::Coord,std::allocator<despot::Coord>>::
        _M_realloc_insert<despot::Coord_const&>
                  ((vector<despot::Coord,std::allocator<despot::Coord>> *)&this->rock_pos_,
                   __position,this_00);
      }
      else {
        *(undefined8 *)__position._M_current = *(undefined8 *)this_00;
        ppCVar1 = &(this->rock_pos_).
                   super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppCVar1 = *ppCVar1 + 8;
      }
      lVar3 = lVar3 + 1;
      this_00 = this_00 + 8;
    } while (lVar3 < this->num_rocks_);
  }
  return;
}

Assistant:

void BaseRockSample::Init_11_11() {
	// Equivalent to RockSample_11_11.pomdp(x)
	cout << "Using special layout for rocksample(11, 11)" << endl;

	Coord rocks[] = { Coord(0, 3), Coord(0, 7), Coord(1, 8), Coord(2, 4), Coord(
		3, 3), Coord(3, 8), Coord(4, 3), Coord(5, 8), Coord(6, 1), Coord(9, 3),
		Coord(9, 9) };

	start_pos_ = Coord(0, 5);
	grid_.SetAllValues(-1);
	for (int i = 0; i < num_rocks_; ++i) {
		grid_(rocks[i]) = i;
		rock_pos_.push_back(rocks[i]);
	}
}